

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogInstance.h
# Opt level: O0

void __thiscall gnilk::LogInstance::LogInstance(LogInstance *this,string *name,Ref *logInstance)

{
  Ref *logInstance_local;
  string *name_local;
  LogInstance *this_local;
  
  this->_vptr_LogInstance = (_func_int **)&PTR__LogInstance_003c8598;
  std::__cxx11::string::string((string *)&this->logName,name);
  std::shared_ptr<gnilk::Log>::shared_ptr(&this->logger,logInstance);
  return;
}

Assistant:

LogInstance(std::string name, Log::Ref logInstance) :
                logName(std::move(name)),
                logger(std::move(logInstance)) {

        }